

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_manager_impl.c
# Opt level: O3

loader_manager_impl loader_manager_impl_initialize(void)

{
  int iVar1;
  loader_manager_impl __ptr;
  vector pvVar2;
  set s;
  undefined8 *puVar3;
  char *canonical;
  uint64_t uVar4;
  plugin ppVar5;
  size_t sVar6;
  size_t __size;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  portability_working_path_length cwd_path_str_length;
  portability_working_path_str cwd_path_str;
  size_t local_1050;
  portability_working_path_length local_1048;
  loader_manager_impl local_1040;
  char local_1038 [4104];
  
  __ptr = (loader_manager_impl)malloc(0x28);
  if (__ptr == (loader_manager_impl)0x0) {
    log_write_impl_va("metacall",0x86,"loader_manager_impl_initialize",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                      ,LOG_LEVEL_ERROR,"Loader failed to allocate its implementation");
  }
  else {
    pvVar2 = vector_create(0x18);
    __ptr->initialization_order = pvVar2;
    if (pvVar2 == (vector)0x0) {
      log_write_impl_va("metacall",0x8e,"loader_manager_impl_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                        ,LOG_LEVEL_ERROR,"Loader failed to allocate the initialization order vector"
                       );
    }
    else {
      s = set_create(hash_callback_ptr,comparable_callback_ptr);
      __ptr->destroy_map = s;
      if (s == (set)0x0) {
        log_write_impl_va("metacall",0x96,"loader_manager_impl_initialize",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                          ,LOG_LEVEL_ERROR,"Loader failed to allocate the destroy map");
      }
      else {
        memset(local_1038,0,0x1000);
        local_1048 = 0;
        local_1050 = 0;
        pvVar2 = vector_create(8);
        if (pvVar2 == (vector)0x0) {
          log_write_impl_va("metacall",0x9e,"loader_manager_impl_initialize",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                            ,LOG_LEVEL_ERROR,"Loader failed to initialize the script paths");
        }
        else {
          iVar1 = portability_working_path(local_1038,&local_1048);
          if (iVar1 == 0) {
            sVar6 = local_1048 + 1;
            pcVar7 = local_1038;
          }
          else {
            pcVar7 = ".";
            sVar6 = 2;
          }
          pcVar7 = environment_variable_path_create("LOADER_SCRIPT_PATH",pcVar7,sVar6,&local_1050);
          log_write_impl_va("metacall",0x50,"loader_manager_impl_script_paths_initialize",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                            ,LOG_LEVEL_DEBUG,"Loader script path: %s",pcVar7);
          if (local_1050 == 0) {
            environment_variable_path_destroy(pcVar7);
          }
          else {
            lVar9 = 0;
            uVar8 = 0;
            sVar6 = local_1050;
            local_1040 = __ptr;
            do {
              if ((pcVar7[uVar8] == '\0') || (pcVar7[uVar8] == ':')) {
                pcVar7[uVar8] = '\0';
                vector_push_back_empty(pvVar2);
                puVar3 = (undefined8 *)vector_back(pvVar2);
                __size = (uVar8 - lVar9) + 1;
                canonical = (char *)malloc(__size);
                *puVar3 = canonical;
                if (canonical == (char *)0x0) {
                  log_write_impl_va("metacall",0x62,"loader_manager_impl_script_paths_initialize",
                                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                                    ,LOG_LEVEL_DEBUG,"Loader script path failed to allocate: %s",
                                    pcVar7 + lVar9);
                }
                else {
                  portability_path_canonical(pcVar7 + lVar9,__size,canonical,__size);
                }
                lVar9 = uVar8 + 1;
                sVar6 = local_1050;
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 < sVar6);
            environment_variable_path_destroy(pcVar7);
            __ptr = local_1040;
          }
          __ptr->script_paths = pvVar2;
          uVar4 = thread_id_get_current();
          __ptr->init_thread_id = uVar4;
          ppVar5 = loader_host_initialize();
          __ptr->host = ppVar5;
          if (ppVar5 != (plugin)0x0) {
            return __ptr;
          }
          log_write_impl_va("metacall",0xa8,"loader_manager_impl_initialize",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                            ,LOG_LEVEL_ERROR,"Loader failed to initialize the host loader");
          loader_manager_impl_script_paths_destroy(pvVar2);
          s = __ptr->destroy_map;
        }
        set_destroy(s);
        pvVar2 = __ptr->initialization_order;
      }
      vector_destroy(pvVar2);
    }
    free(__ptr);
  }
  return (loader_manager_impl)0x0;
}

Assistant:

loader_manager_impl loader_manager_impl_initialize(void)
{
	loader_manager_impl manager_impl = malloc(sizeof(struct loader_manager_impl_type));

	if (manager_impl == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to allocate its implementation");
		goto alloc_error;
	}

	manager_impl->initialization_order = vector_create(sizeof(struct loader_initialization_order_type));

	if (manager_impl->initialization_order == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to allocate the initialization order vector");
		goto initialization_order_error;
	}

	manager_impl->destroy_map = set_create(&hash_callback_ptr, &comparable_callback_ptr);

	if (manager_impl->destroy_map == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to allocate the destroy map");
		goto destroy_map_error;
	}

	manager_impl->script_paths = loader_manager_impl_script_paths_initialize();

	if (manager_impl->script_paths == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to initialize the script paths");
		goto script_paths_error;
	}

	manager_impl->init_thread_id = thread_id_get_current();

	manager_impl->host = loader_host_initialize();

	if (manager_impl->host == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to initialize the host loader");
		goto host_error;
	}

	return manager_impl;

host_error:
	loader_manager_impl_script_paths_destroy(manager_impl->script_paths);
script_paths_error:
	set_destroy(manager_impl->destroy_map);
destroy_map_error:
	vector_destroy(manager_impl->initialization_order);
initialization_order_error:
	free(manager_impl);
alloc_error:
	return NULL;
}